

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  ZSTD_Sequence *pZVar1;
  BYTE BVar2;
  ZSTD_sequenceFormat_e value;
  uint uVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  short sVar6;
  ushort uVar7;
  int iVar8;
  size_t err_code;
  size_t sVar9;
  size_t sVar10;
  code *pcVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  XXH64_hash_t XVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  short *psVar19;
  size_t err_code_1;
  ulong uVar20;
  BYTE *op;
  ulong uVar21;
  bool bVar22;
  undefined8 uVar23;
  ulong local_48 [3];
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6b4d,
                  "size_t ZSTD_compressSequences(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  sVar9 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (sVar9 < 0xffffffffffffff89) {
    sVar10 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
      XXH_INLINE_XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_48[0] = 0;
    local_48[1] = 0;
    value = (cctx->appliedParams).blockDelimiters;
    iVar8 = ZSTD_cParam_withinBounds(ZSTD_c_experimentalParam11,value);
    if (iVar8 == 0) {
      __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6a88,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)");
    }
    if (value == ZSTD_sf_explicitBlockDelimiters) {
      pcVar11 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    }
    else {
      if (value != ZSTD_sf_noBlockDelimiters) {
        __assert_fail("sequenceCopier != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6a8e,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)"
                     );
      }
      pcVar11 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
    }
    psVar19 = (short *)((long)dst + sVar10);
    uVar20 = dstCapacity - sVar10;
    uVar23 = 0xffffffffffffffba;
    if (srcSize == 0) {
      if (uVar20 < 4) {
        return 0xffffffffffffffba;
      }
      psVar19[0] = 1;
      psVar19[1] = 0;
      psVar19 = (short *)((long)psVar19 + 3);
      uVar17 = uVar20 - 3;
      uVar23 = 3;
      uVar21 = 3;
    }
    else {
      uVar21 = 0;
      uVar17 = uVar20;
    }
    for (; srcSize != 0; srcSize = srcSize - uVar18) {
      uVar14 = cctx->blockSize;
      if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
        uVar18 = uVar14;
        if (srcSize < uVar14) {
          uVar18 = srcSize;
        }
        bVar22 = srcSize <= uVar14;
        if (0xffffffffffffff88 < uVar18) {
          return uVar18;
        }
      }
      else {
        uVar18 = local_48[0] & 0xffffffff;
        if (inSeqsSize < uVar18) {
          __assert_fail("spos <= inSeqsSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6a9d,
                        "size_t blockSize_explicitDelimiter(const ZSTD_Sequence *, size_t, ZSTD_sequencePosition)"
                       );
        }
        lVar16 = (inSeqsSize + 1) - uVar18;
        puVar12 = &inSeqs[uVar18].matchLength;
        uVar18 = 0;
        do {
          lVar16 = lVar16 + -1;
          if (lVar16 == 0) {
            return 0xffffffffffffff95;
          }
          uVar3 = *puVar12;
          uVar18 = uVar18 + (puVar12[-1] + uVar3);
          pZVar1 = (ZSTD_Sequence *)(puVar12 + -2);
          puVar12 = puVar12 + 4;
        } while (pZVar1->offset != 0);
        uVar23 = 0xffffffffffffff95;
        uVar13 = 0xffffffffffffff95;
        if (uVar3 == 0) {
          uVar13 = uVar18;
        }
        if (0xffffffffffffff88 < uVar13) {
          return uVar13;
        }
        if ((uVar14 < uVar13) || (bVar22 = uVar13 == srcSize, srcSize < uVar13)) {
          return 0xffffffffffffff95;
        }
      }
      (cctx->seqStore).lit = (cctx->seqStore).litStart;
      (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
      (cctx->seqStore).longLengthType = ZSTD_llt_none;
      uVar14 = (*pcVar11)(cctx,local_48,inSeqs,inSeqsSize,src,uVar18,
                          (cctx->appliedParams).searchForExternalRepcodes);
      if (0xffffffffffffff88 < uVar14) {
        return uVar14;
      }
      uVar18 = uVar18 - uVar14;
      sVar6 = (short)uVar18;
      if (uVar18 < 7) {
        uVar14 = uVar18 + 3;
        if (uVar17 < uVar14) {
          return 0xffffffffffffffba;
        }
        *psVar19 = (ushort)bVar22 + sVar6 * 8;
        *(undefined1 *)(psVar19 + 1) = 0;
        uVar23 = 0x164745;
        memcpy((void *)((long)psVar19 + 3),src,uVar18);
        uVar21 = uVar21 + uVar14;
      }
      else {
        if (uVar17 < 3) {
          return 0xffffffffffffffba;
        }
        sVar9 = ZSTD_entropyCompressSeqStore
                          (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                           &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                           (void *)((long)psVar19 + 3),uVar17 - 3,uVar18,cctx->entropyWorkspace,
                           (ulong)(uint)cctx->bmi2,(int)uVar23);
        if (0xffffffffffffff88 < sVar9) {
          return sVar9;
        }
        uVar7 = (ushort)bVar22;
        if (cctx->isFirstBlock == 0) {
          uVar23 = 0x164826;
          iVar8 = ZSTD_maybeRLE(&cctx->seqStore);
          if (iVar8 == 0) goto LAB_001647bc;
          uVar23 = 0x164836;
          iVar8 = ZSTD_isRLE((BYTE *)src,uVar18);
          if (iVar8 == 0) goto LAB_001647bc;
LAB_0016483a:
          if (uVar17 == 3) {
            return 0xffffffffffffffba;
          }
          BVar2 = *src;
          *psVar19 = uVar7 + sVar6 * 8 + 2;
          *(char *)(psVar19 + 1) = (char)(uVar18 >> 0xd);
          *(BYTE *)((long)psVar19 + 3) = BVar2;
          uVar23 = 4;
          uVar14 = 4;
        }
        else {
LAB_001647bc:
          if (sVar9 == 1) goto LAB_0016483a;
          if (sVar9 == 0) {
            uVar14 = uVar18 + 3;
            if (uVar17 < uVar14) {
              return 0xffffffffffffffba;
            }
            *psVar19 = uVar7 + sVar6 * 8;
            *(char *)(psVar19 + 1) = (char)(uVar18 >> 0xd);
            uVar23 = 0x1647fc;
            memcpy((void *)((long)psVar19 + 3),src,uVar18);
            if (0xffffffffffffff88 < uVar14) {
              return uVar14;
            }
          }
          else {
            pZVar4 = (cctx->blockState).prevCBlock;
            pZVar5 = (cctx->blockState).nextCBlock;
            (cctx->blockState).prevCBlock = pZVar5;
            (cctx->blockState).nextCBlock = pZVar4;
            if ((pZVar5->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar5->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            *psVar19 = uVar7 + (short)sVar9 * 8 + 4;
            *(char *)(psVar19 + 1) = (char)(sVar9 >> 0xd);
            uVar14 = sVar9 + 3;
          }
        }
        uVar21 = uVar21 + uVar14;
        if (bVar22 != false) break;
        cctx->isFirstBlock = 0;
      }
      uVar17 = uVar17 - uVar14;
      src = (void *)((long)src + uVar18);
      psVar19 = (short *)((long)psVar19 + uVar14);
    }
    sVar9 = uVar21;
    if ((uVar21 < 0xffffffffffffff89) &&
       (sVar9 = sVar10 + uVar21, (cctx->appliedParams).fParams.checksumFlag != 0)) {
      XVar15 = XXH_INLINE_XXH64_digest(&cctx->xxhState);
      if (uVar20 - uVar21 < 4) {
        sVar9 = 0xffffffffffffffba;
      }
      else {
        *(int *)((long)dst + sVar9) = (int)XVar15;
        sVar9 = sVar9 + 4;
      }
    }
  }
  return sVar9;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}